

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.h
# Opt level: O2

bool __thiscall
capnp::SchemaLoader::CompatibilityChecker::canUpgradeToData(CompatibilityChecker *this,Reader *type)

{
  short sVar1;
  bool bVar2;
  Reader RStack_68;
  Reader local_38;
  
  if (0xf < (type->_reader).dataSize) {
    sVar1 = *(type->_reader).data;
    if (sVar1 == 0xc) {
      return true;
    }
    if (sVar1 == 0xe) {
      local_38._reader.segment = (type->_reader).segment;
      local_38._reader.capTable = (type->_reader).capTable;
      local_38._reader.data = (type->_reader).data;
      local_38._reader.pointers = (type->_reader).pointers;
      local_38._reader.dataSize = (type->_reader).dataSize;
      local_38._reader.pointerCount = (type->_reader).pointerCount;
      local_38._reader._38_2_ = *(undefined2 *)&(type->_reader).field_0x26;
      local_38._reader.nestingLimit = (type->_reader).nestingLimit;
      local_38._reader._44_4_ = *(undefined4 *)&(type->_reader).field_0x2c;
      capnp::schema::Type::List::Reader::getElementType(&RStack_68,&local_38);
      if (RStack_68._reader.dataSize < 0x10) {
        bVar2 = false;
      }
      else {
        bVar2 = (*RStack_68._reader.data - 2U & 0xfffb) == 0;
      }
      return bVar2;
    }
  }
  return false;
}

Assistant:

inline T StructReader::getDataField(StructDataOffset offset) const {
  if ((offset + ONE * ELEMENTS) * capnp::bitsPerElement<T>() <= dataSize) {
    return reinterpret_cast<const WireValue<T>*>(data)[unbound(offset / ELEMENTS)].get();
  } else {
    return static_cast<T>(0);
  }
}